

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerSettings.cpp
# Opt level: O1

void __thiscall USBAnalyzerSettings::USBAnalyzerSettings(USBAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceNumberList *this_02;
  AnalyzerSettingInterfaceNumberList *this_03;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__USBAnalyzerSettings_0015a698;
  Channel::Channel(&this->mDPChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mDMChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mSpeed = LOW_SPEED;
  this->mDecodeLevel = OUT_CONTROL_TRANSFERS;
  this_00 = &this->mDPChannelInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  this_01 = &this->mDMChannelInterface;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  this_02 = &this->mSpeedInterface;
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_02);
  this_03 = &this->mDecodeLevelInterface;
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_03);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_00,"D+");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_00);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01,"D-");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_01);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02,"USB bit-rate");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_02,"Low speed (1.5 Mbps)");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_02,"Full speed (12 Mbps)");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mSpeed);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03,"USB decode level");
  AnalyzerSettingInterfaceNumberList::AddNumber(3.0,(char *)this_03,"Control transfers");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_03,"Packets");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_03,"Bytes");
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)this_03,"Signals");
  AnalyzerSettingInterfaceNumberList::SetNumber(3.0);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddExportOption((uint)this,(char *)0x0);
  AnalyzerSettings::AddExportExtension((uint)this,(char *)0x0,"text");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDPChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDMChannel,true);
  return;
}

Assistant:

USBAnalyzerSettings::USBAnalyzerSettings()
    : mDMChannel( UNDEFINED_CHANNEL ), mDPChannel( UNDEFINED_CHANNEL ), mSpeed( LOW_SPEED ), mDecodeLevel( OUT_CONTROL_TRANSFERS )
{
    // init the interface
    mDPChannelInterface.SetTitleAndTooltip( "D+", "USB D+ (green)" );
    mDPChannelInterface.SetChannel( mDPChannel );

    mDMChannelInterface.SetTitleAndTooltip( "D-", "USB D- (white)" );
    mDMChannelInterface.SetChannel( mDMChannel );

    mSpeedInterface.SetTitleAndTooltip( "USB bit-rate", "USB data bit-rate" );
    mSpeedInterface.AddNumber( LOW_SPEED, "Low speed (1.5 Mbps)", "Low speed (1.5 mbit/s)" );
    mSpeedInterface.AddNumber( FULL_SPEED, "Full speed (12 Mbps)", "Full speed (12 mbit/s)" );

    mSpeedInterface.SetNumber( mSpeed );

    mDecodeLevelInterface.SetTitleAndTooltip( "USB decode level", "Type of decoded USB output" );
    mDecodeLevelInterface.AddNumber( OUT_CONTROL_TRANSFERS, "Control transfers", "Decodes the standard USB enpoint 0 control transfers." );
    mDecodeLevelInterface.AddNumber( OUT_PACKETS, "Packets", "Decode all the fields of USB packets" );
    mDecodeLevelInterface.AddNumber( OUT_BYTES, "Bytes", "Decode the data as raw bytes" );
    mDecodeLevelInterface.AddNumber( OUT_SIGNALS, "Signals", "Decode the USB signal states: J, K and SE0" );

    mDecodeLevelInterface.SetNumber( OUT_CONTROL_TRANSFERS );

    // add the interface
    AddInterface( &mDPChannelInterface );
    AddInterface( &mDMChannelInterface );
    AddInterface( &mSpeedInterface );
    AddInterface( &mDecodeLevelInterface );

    // describe export
    AddExportOption( 0, "Export as text file" );
    AddExportExtension( 0, "text", "txt" );

    ClearChannels();

    AddChannel( mDPChannel, "D+", false );
    AddChannel( mDMChannel, "D-", false );
}